

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O0

int mriStepCoupling_GetStageType(MRIStepCoupling MRIC,int is)

{
  double dVar1;
  sunrealtype tol;
  sunrealtype cdiff;
  sunrealtype Gabs;
  int i;
  int is_local;
  MRIStepCoupling MRIC_local;
  int local_4;
  
  if ((is < 1) || (MRIC->stages <= is)) {
    local_4 = -0x29;
  }
  else {
    Gabs = 0.0;
    if (MRIC->G != (sunrealtype ***)0x0) {
      for (i = 0; i < MRIC->nmat; i = i + 1) {
        Gabs = ABS(MRIC->G[i][is][is]) + Gabs;
      }
    }
    dVar1 = MRIC->c[is] - MRIC->c[is + -1];
    if (Gabs <= 2.220446049250313e-14) {
      if (dVar1 <= 2.220446049250313e-14) {
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
    else if (dVar1 <= 2.220446049250313e-14) {
      local_4 = 2;
    }
    else {
      local_4 = 3;
    }
  }
  return local_4;
}

Assistant:

int mriStepCoupling_GetStageType(MRIStepCoupling MRIC, int is)
{
  int i;
  sunrealtype Gabs, cdiff;
  const sunrealtype tol = SUN_RCONST(100.0) * SUN_UNIT_ROUNDOFF;

  if ((is < 1) || (is >= MRIC->stages)) { return ARK_INVALID_TABLE; }

  /* sum of stage diagonal entries across implicit tables */
  Gabs = ZERO;
  if (MRIC->G)
  {
    for (i = 0; i < MRIC->nmat; i++) { Gabs += SUNRabs(MRIC->G[i][is][is]); }
  }

  /* abscissae difference */
  cdiff = MRIC->c[is] - MRIC->c[is - 1];

  if (Gabs > tol)
  { /* DIRK */
    if (cdiff > tol)
    { /* Fast */
      return (MRISTAGE_DIRK_FAST);
    }
    else { return (MRISTAGE_DIRK_NOFAST); }
  }
  else
  { /* ERK */
    if (cdiff > tol)
    { /* Fast */
      return (MRISTAGE_ERK_FAST);
    }
    else { return (MRISTAGE_ERK_NOFAST); }
  }
}